

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O0

void duckdb::ThrowNumericCastError<unsigned_long,signed_char>
               (char in,unsigned_long minval,unsigned_long maxval)

{
  undefined8 uVar1;
  string *in_RDX;
  InternalException *in_RSI;
  allocator local_39;
  string local_38 [8];
  unsigned_long in_stack_ffffffffffffffd0;
  unsigned_long in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffe7;
  
  uVar1 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             &local_39);
  InternalException::InternalException<signed_char,unsigned_long,unsigned_long>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe7,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

static void ThrowNumericCastError(FROM in, TO minval, TO maxval) {
	throw InternalException("Information loss on integer cast: value %d outside of target range [%d, %d]", in, minval,
	                        maxval);
}